

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

wchar_t property_cost(obj_property *prop,wchar_t value,_Bool price)

{
  wchar_t local_2c;
  _Bool price_local;
  wchar_t value_local;
  obj_property *prop_local;
  
  if (price) {
    local_2c = value;
    if (value < L'\x01') {
      local_2c = -value;
    }
    prop_local._4_4_ =
         prop->price_constant + prop->price_linear * value + prop->price_square * value * local_2c;
  }
  else {
    prop_local._4_4_ =
         prop->design_constant + prop->design_linear * value + prop->design_square * value * value;
  }
  return prop_local._4_4_;
}

Assistant:

int property_cost(struct obj_property *prop, int value, bool price)
{
	if (price) {
		return prop->price_constant + prop->price_linear * value +
			prop->price_square * value * ((value > 0) ? value : (0 - value));
	}

	return prop->design_constant + prop->design_linear * value +
		prop->design_square * value * value;
}